

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geo_parquet.cpp
# Opt level: O3

void __thiscall
duckdb::GeoParquetColumnMetadataWriter::GeoParquetColumnMetadataWriter
          (GeoParquetColumnMetadataWriter *this,ClientContext *context)

{
  size_type *psVar1;
  size_type *psVar2;
  _Tuple_impl<0UL,_duckdb::ExpressionExecutor_*,_std::default_delete<duckdb::ExpressionExecutor>_>
  __ptr_00;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var3;
  undefined8 uVar4;
  DataChunk *this_00;
  GeoParquetColumnMetadataWriter *this_01;
  _func_int **pp_Var5;
  _func_int **pp_Var6;
  _func_int **pp_Var7;
  _Tuple_impl<0UL,_duckdb::ExpressionExecutor_*,_std::default_delete<duckdb::ExpressionExecutor>_>
  this_02;
  Catalog *this_03;
  BoundReferenceExpression *pBVar8;
  _Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_> this_04;
  pointer pEVar9;
  type pEVar10;
  pointer *__ptr;
  long lVar11;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  initializer_list<duckdb::LogicalType> __l_02;
  initializer_list<duckdb::LogicalType> __l_03;
  LogicalTypeId type_type;
  LogicalType wkb_type;
  LogicalType flag_type;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  bbox_args;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  flag_args;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  type_args;
  LogicalType bbox_type;
  ScalarFunction flag_func;
  ScalarFunction bbox_func;
  ScalarFunction type_func;
  undefined1 local_4f2 [2];
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_4f0;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_4e8;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_4e0;
  LogicalType local_4d8 [3];
  LogicalType local_490;
  LogicalType local_478;
  undefined1 local_460 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448;
  _Alloc_hider local_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  pointer local_418;
  DataChunk *local_410;
  DataChunk *local_408;
  GeoParquetColumnMetadataWriter *local_400;
  pointer local_3f8;
  pointer pLStack_3f0;
  undefined1 local_3e8 [8];
  undefined1 local_3e0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c8;
  undefined1 local_3b8 [16];
  ScalarFunction local_3a8;
  ScalarFunction local_280;
  ScalarFunction local_158;
  
  (this->executor).
  super_unique_ptr<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionExecutor_*,_std::default_delete<duckdb::ExpressionExecutor>_>
  .super__Head_base<0UL,_duckdb::ExpressionExecutor_*,_false> =
       (_Head_base<0UL,_duckdb::ExpressionExecutor_*,_false>)0x0;
  local_410 = &this->input_chunk;
  local_400 = this;
  DataChunk::DataChunk(local_410);
  DataChunk::DataChunk(&this->result_chunk);
  local_4e0 = &this->type_expr;
  local_4e8 = &this->flag_expr;
  local_4f0 = &this->bbox_expr;
  (this->type_expr).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
  _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  (this->flag_expr).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
  _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  (this->bbox_expr).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
  _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  local_408 = &this->result_chunk;
  this_02.super__Head_base<0UL,_duckdb::ExpressionExecutor_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::ExpressionExecutor_*,_false>)operator_new(0x48);
  ExpressionExecutor::ExpressionExecutor
            ((ExpressionExecutor *)
             this_02.super__Head_base<0UL,_duckdb::ExpressionExecutor_*,_false>._M_head_impl,context
            );
  __ptr_00.super__Head_base<0UL,_duckdb::ExpressionExecutor_*,_false>._M_head_impl =
       (this->executor).
       super_unique_ptr<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ExpressionExecutor_*,_std::default_delete<duckdb::ExpressionExecutor>_>
       .super__Head_base<0UL,_duckdb::ExpressionExecutor_*,_false>;
  (this->executor).
  super_unique_ptr<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionExecutor_*,_std::default_delete<duckdb::ExpressionExecutor>_>
  .super__Head_base<0UL,_duckdb::ExpressionExecutor_*,_false> =
       this_02.super__Head_base<0UL,_duckdb::ExpressionExecutor_*,_false>._M_head_impl;
  if (__ptr_00.super__Head_base<0UL,_duckdb::ExpressionExecutor_*,_false>._M_head_impl !=
      (ExpressionExecutor *)0x0) {
    ::std::default_delete<duckdb::ExpressionExecutor>::operator()
              ((default_delete<duckdb::ExpressionExecutor> *)this,
               (ExpressionExecutor *)
               __ptr_00.super__Head_base<0UL,_duckdb::ExpressionExecutor_*,_false>._M_head_impl);
  }
  this_03 = Catalog::GetSystemCatalog(context);
  psVar1 = &local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
            _M_string_length;
  local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)psVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"main","");
  psVar2 = &local_3a8.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
            _M_string_length;
  local_3a8.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)psVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"st_geometrytype","");
  local_280.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)
       Catalog::GetEntry<duckdb::ScalarFunctionCatalogEntry>
                 (this_03,context,(string *)&local_158,(string *)&local_3a8,THROW_EXCEPTION,
                  (QueryErrorContext)0xffffffffffffffff);
  optional_ptr<duckdb::ScalarFunctionCatalogEntry,_true>::CheckValid
            ((optional_ptr<duckdb::ScalarFunctionCatalogEntry,_true> *)&local_280);
  pp_Var5 = local_280.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function;
  if (local_3a8.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function !=
      (_func_int **)psVar2) {
    operator_delete(local_3a8.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                    _vptr_Function);
  }
  if (local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function !=
      (_func_int **)psVar1) {
    operator_delete(local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                    _vptr_Function);
  }
  local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)psVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"main","");
  local_3a8.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)psVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"st_zmflag","");
  local_280.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)
       Catalog::GetEntry<duckdb::ScalarFunctionCatalogEntry>
                 (this_03,context,(string *)&local_158,(string *)&local_3a8,THROW_EXCEPTION,
                  (QueryErrorContext)0xffffffffffffffff);
  optional_ptr<duckdb::ScalarFunctionCatalogEntry,_true>::CheckValid
            ((optional_ptr<duckdb::ScalarFunctionCatalogEntry,_true> *)&local_280);
  pp_Var6 = local_280.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function;
  if (local_3a8.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function !=
      (_func_int **)psVar2) {
    operator_delete(local_3a8.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                    _vptr_Function);
  }
  if (local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function !=
      (_func_int **)psVar1) {
    operator_delete(local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                    _vptr_Function);
  }
  local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)psVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"main","");
  local_3a8.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)psVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"st_extent","");
  local_280.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)
       Catalog::GetEntry<duckdb::ScalarFunctionCatalogEntry>
                 (this_03,context,(string *)&local_158,(string *)&local_3a8,THROW_EXCEPTION,
                  (QueryErrorContext)0xffffffffffffffff);
  optional_ptr<duckdb::ScalarFunctionCatalogEntry,_true>::CheckValid
            ((optional_ptr<duckdb::ScalarFunctionCatalogEntry,_true> *)&local_280);
  pp_Var7 = local_280.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function;
  if (local_3a8.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function !=
      (_func_int **)psVar2) {
    operator_delete(local_3a8.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                    _vptr_Function);
  }
  if (local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function !=
      (_func_int **)psVar1) {
    operator_delete(local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                    _vptr_Function);
  }
  this_00 = local_408;
  LogicalType::LogicalType(&local_478,BLOB);
  local_3c8._M_allocated_capacity = (size_type)(element_type *)(local_3e0 + 0x28);
  ::std::__cxx11::string::_M_construct<char_const*>((string *)(local_3e0 + 0x18),"WKB_BLOB","");
  LogicalType::SetAlias(&local_478,(string *)(local_3e0 + 0x18));
  if ((element_type *)local_3c8._M_allocated_capacity != (element_type *)(local_3e0 + 0x28)) {
    operator_delete((void *)local_3c8._M_allocated_capacity);
  }
  this_01 = local_400;
  LogicalType::LogicalType((LogicalType *)&local_280,&local_478);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_280;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_3a8,__l,
             (allocator_type *)local_4d8);
  ScalarFunctionSet::GetFunctionByArguments
            (&local_158,(ScalarFunctionSet *)((long)pp_Var5 + 0x158),context,
             (vector<duckdb::LogicalType,_true> *)&local_3a8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_3a8);
  LogicalType::~LogicalType((LogicalType *)&local_280);
  LogicalType::LogicalType(local_4d8,&local_478);
  __l_00._M_len = 1;
  __l_00._M_array = local_4d8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_280,__l_00,
             (allocator_type *)local_460);
  ScalarFunctionSet::GetFunctionByArguments
            (&local_3a8,(ScalarFunctionSet *)((long)pp_Var6 + 0x158),context,
             (vector<duckdb::LogicalType,_true> *)&local_280);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_280);
  LogicalType::~LogicalType(local_4d8);
  LogicalType::LogicalType((LogicalType *)local_460,&local_478);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)local_460;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_4d8,__l_01,
             (allocator_type *)local_3e0);
  ScalarFunctionSet::GetFunctionByArguments
            (&local_280,(ScalarFunctionSet *)((long)pp_Var7 + 0x158),context,
             (vector<duckdb::LogicalType,_true> *)local_4d8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_4d8);
  LogicalType::~LogicalType((LogicalType *)local_460);
  local_4f2[0] = UTINYINT;
  LogicalType::LogicalType((LogicalType *)local_460,&local_3a8.super_BaseScalarFunction.return_type)
  ;
  LogicalType::LogicalType((LogicalType *)local_3e0,&local_280.super_BaseScalarFunction.return_type)
  ;
  local_3f8 = (pointer)0x0;
  pLStack_3f0 = (pointer)0x0;
  local_3e8[0] = INVALID;
  local_3e8[1] = ~INVALID;
  local_3e8._2_6_ = 0;
  pBVar8 = (BoundReferenceExpression *)operator_new(0x60);
  LogicalType::LogicalType(local_4d8,&local_478);
  BoundReferenceExpression::BoundReferenceExpression(pBVar8,local_4d8,0);
  LogicalType::~LogicalType(local_4d8);
  local_428._M_allocated_capacity = (size_type)pBVar8;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
              *)&local_3f8,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             (local_460 + 0x38));
  if ((BoundReferenceExpression *)local_428._M_allocated_capacity != (BoundReferenceExpression *)0x0
     ) {
    (**(code **)(*(long *)local_428._M_allocated_capacity + 8))();
  }
  local_428._M_allocated_capacity = 0;
  local_428._8_8_ = 0;
  local_418 = (pointer)0x0;
  pBVar8 = (BoundReferenceExpression *)operator_new(0x60);
  LogicalType::LogicalType(local_4d8,&local_478);
  BoundReferenceExpression::BoundReferenceExpression(pBVar8,local_4d8,0);
  LogicalType::~LogicalType(local_4d8);
  local_448._M_allocated_capacity = (size_type)pBVar8;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
              *)(local_460 + 0x38),
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             (local_460 + 0x18));
  if ((BoundReferenceExpression *)local_448._M_allocated_capacity != (BoundReferenceExpression *)0x0
     ) {
    (**(code **)(*(long *)local_448._M_allocated_capacity + 8))();
  }
  local_448._M_allocated_capacity = 0;
  local_448._8_8_ = 0;
  local_438._M_p = (pointer)0x0;
  this_04.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::Expression_*,_false>)operator_new(0x60);
  LogicalType::LogicalType(local_4d8,&local_478);
  BoundReferenceExpression::BoundReferenceExpression
            ((BoundReferenceExpression *)
             this_04.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl,local_4d8,0);
  LogicalType::~LogicalType(local_4d8);
  local_490._0_8_ = this_04.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
              *)(local_460 + 0x18),
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_490);
  if ((tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)local_490._0_8_ !=
      (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
    (*(((Expression *)local_490._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_490._0_8_ = (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0;
  make_uniq<duckdb::BoundFunctionExpression,duckdb::LogicalTypeId&,duckdb::ScalarFunction&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,decltype(nullptr)>
            (&local_4d8[0].id_,(ScalarFunction *)local_4f2,
             (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              *)&local_158,&local_3f8);
  uVar4 = local_4d8[0]._0_8_;
  local_4d8[0]._0_8_ = (Expression *)0x0;
  _Var3._M_head_impl =
       (local_4e0->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (local_4e0->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar4;
  if (_Var3._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
    if ((Expression *)local_4d8[0]._0_8_ != (Expression *)0x0) {
      (**(code **)(*(long *)local_4d8[0]._0_8_ + 8))();
    }
  }
  local_490._0_8_ = (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0;
  make_uniq<duckdb::BoundFunctionExpression,duckdb::LogicalType&,duckdb::ScalarFunction&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,decltype(nullptr)>
            (local_4d8,(ScalarFunction *)local_460,
             (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              *)&local_3a8,(void **)(local_460 + 0x38));
  uVar4 = local_4d8[0]._0_8_;
  local_4d8[0]._0_8_ = (Expression *)0x0;
  _Var3._M_head_impl =
       (local_4e8->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (local_4e8->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar4;
  if (_Var3._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
    if ((Expression *)local_4d8[0]._0_8_ != (Expression *)0x0) {
      (**(code **)(*(long *)local_4d8[0]._0_8_ + 8))();
    }
  }
  local_490._0_8_ =
       (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)0x0
  ;
  make_uniq<duckdb::BoundFunctionExpression,duckdb::LogicalType&,duckdb::ScalarFunction&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,decltype(nullptr)>
            (local_4d8,(ScalarFunction *)local_3e0,
             (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              *)&local_280,(void **)(local_460 + 0x18));
  uVar4 = local_4d8[0]._0_8_;
  local_4d8[0]._0_8_ = (long *)0x0;
  _Var3._M_head_impl =
       (local_4f0->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (local_4f0->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar4;
  if (_Var3._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
    if ((long *)local_4d8[0]._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_4d8[0]._0_8_ + 8))();
    }
  }
  pEVar9 = unique_ptr<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>,_true>
           ::operator->(&this_01->executor);
  pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                      (local_4e0);
  ExpressionExecutor::AddExpression(pEVar9,pEVar10);
  pEVar9 = unique_ptr<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>,_true>
           ::operator->(&this_01->executor);
  pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                      (local_4e8);
  ExpressionExecutor::AddExpression(pEVar9,pEVar10);
  pEVar9 = unique_ptr<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>,_true>
           ::operator->(&this_01->executor);
  pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                      (local_4f0);
  ExpressionExecutor::AddExpression(pEVar9,pEVar10);
  LogicalType::LogicalType(&local_490,&local_478);
  __l_02._M_len = 1;
  __l_02._M_array = &local_490;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_4d8,__l_02,
             (allocator_type *)(local_4f2 + 1));
  DataChunk::InitializeEmpty(local_410,(vector<duckdb::LogicalType,_true> *)local_4d8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_4d8);
  LogicalType::~LogicalType(&local_490);
  LogicalType::LogicalType(local_4d8,local_4f2[0]);
  LogicalType::LogicalType(local_4d8 + 1,(LogicalType *)local_460);
  LogicalType::LogicalType(local_4d8 + 2,(LogicalType *)local_3e0);
  __l_03._M_len = 3;
  __l_03._M_array = local_4d8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_490,__l_03,
             (allocator_type *)(local_4f2 + 1));
  DataChunk::Initialize(this_00,context,(vector<duckdb::LogicalType,_true> *)&local_490,0x800);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_490);
  lVar11 = 0x30;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_4d8[0].id_ + lVar11));
    lVar11 = lVar11 + -0x18;
  } while (lVar11 != -0x18);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)(local_460 + 0x18));
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)(local_460 + 0x38));
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)&local_3f8);
  LogicalType::~LogicalType((LogicalType *)local_3e0);
  LogicalType::~LogicalType((LogicalType *)local_460);
  local_280.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02432a00;
  if (local_280.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_280.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_280.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_280.function.super__Function_base._M_manager)
              ((_Any_data *)&local_280.function,(_Any_data *)&local_280.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_280.super_BaseScalarFunction);
  local_3a8.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02432a00;
  if (local_3a8.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3a8.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_3a8.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3a8.function.super__Function_base._M_manager)
              ((_Any_data *)&local_3a8.function,(_Any_data *)&local_3a8.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_3a8.super_BaseScalarFunction);
  local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02432a00;
  if (local_158.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_158.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_158.function.super__Function_base._M_manager)
              ((_Any_data *)&local_158.function,(_Any_data *)&local_158.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_158.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_478);
  return;
}

Assistant:

GeoParquetColumnMetadataWriter::GeoParquetColumnMetadataWriter(ClientContext &context) {
	executor = make_uniq<ExpressionExecutor>(context);

	auto &catalog = Catalog::GetSystemCatalog(context);

	// These functions are required to extract the geometry type, ZM flag and bounding box from a WKB blob
	auto &type_func_set = catalog.GetEntry<ScalarFunctionCatalogEntry>(context, DEFAULT_SCHEMA, "st_geometrytype");
	auto &flag_func_set = catalog.GetEntry<ScalarFunctionCatalogEntry>(context, DEFAULT_SCHEMA, "st_zmflag");
	auto &bbox_func_set = catalog.GetEntry<ScalarFunctionCatalogEntry>(context, DEFAULT_SCHEMA, "st_extent");

	auto wkb_type = LogicalType(LogicalTypeId::BLOB);
	wkb_type.SetAlias("WKB_BLOB");

	auto type_func = type_func_set.functions.GetFunctionByArguments(context, {wkb_type});
	auto flag_func = flag_func_set.functions.GetFunctionByArguments(context, {wkb_type});
	auto bbox_func = bbox_func_set.functions.GetFunctionByArguments(context, {wkb_type});

	auto type_type = LogicalType::UTINYINT;
	auto flag_type = flag_func.return_type;
	auto bbox_type = bbox_func.return_type;

	vector<unique_ptr<Expression>> type_args;
	type_args.push_back(make_uniq<BoundReferenceExpression>(wkb_type, 0));

	vector<unique_ptr<Expression>> flag_args;
	flag_args.push_back(make_uniq<BoundReferenceExpression>(wkb_type, 0));

	vector<unique_ptr<Expression>> bbox_args;
	bbox_args.push_back(make_uniq<BoundReferenceExpression>(wkb_type, 0));

	type_expr = make_uniq<BoundFunctionExpression>(type_type, type_func, std::move(type_args), nullptr);
	flag_expr = make_uniq<BoundFunctionExpression>(flag_type, flag_func, std::move(flag_args), nullptr);
	bbox_expr = make_uniq<BoundFunctionExpression>(bbox_type, bbox_func, std::move(bbox_args), nullptr);

	// Add the expressions to the executor
	executor->AddExpression(*type_expr);
	executor->AddExpression(*flag_expr);
	executor->AddExpression(*bbox_expr);

	// Initialize the input and result chunks
	// The input chunk should be empty, as we always reference the input vector
	input_chunk.InitializeEmpty({wkb_type});
	result_chunk.Initialize(context, {type_type, flag_type, bbox_type});
}